

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O2

void Abc_NtkMfsPowerResub(Mfs_Man_t *p,Mfs_Par_t *pPars)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  long lVar4;
  int iVar5;
  float fVar6;
  
  pNtk = p->pNtk;
  iVar1 = Abc_NtkGetFaninMax(pNtk);
  for (iVar5 = 0; iVar2 = pNtk->vObjs->nSize, iVar5 < iVar2; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar5);
    if ((((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
        ((iVar2 = p->pPars->nDepthMax, iVar2 == 0 ||
         ((int)(*(uint *)&pAVar3->field_0x14 >> 0xc) <= iVar2)))) &&
       (iVar2 = (pAVar3->vFanins).nSize, iVar2 <= iVar1 && 1 < iVar2)) {
      iVar2 = Abc_WinNode(p,pAVar3);
      if (iVar2 == 0) {
        for (lVar4 = 0; lVar4 < (pAVar3->vFanins).nSize; lVar4 = lVar4 + 1) {
          fVar6 = Abc_MfsObjProb(p,(Abc_Obj_t *)
                                   pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar4]]);
          if (0.35 <= fVar6) {
            Abc_NtkMfsSolveSatResub(p,pAVar3,(int)lVar4,0,0);
          }
        }
      }
    }
  }
  for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar5);
    if ((((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
        ((iVar2 = p->pPars->nDepthMax, iVar2 == 0 ||
         ((int)(*(uint *)&pAVar3->field_0x14 >> 0xc) <= iVar2)))) &&
       (iVar2 = (pAVar3->vFanins).nSize, iVar2 <= iVar1 && 1 < iVar2)) {
      iVar2 = Abc_WinNode(p,pAVar3);
      if (iVar2 == 0) {
        for (lVar4 = 0; lVar4 < (pAVar3->vFanins).nSize; lVar4 = lVar4 + 1) {
          fVar6 = Abc_MfsObjProb(p,(Abc_Obj_t *)
                                   pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar4]]);
          if (0.35 <= fVar6) {
            Abc_NtkMfsSolveSatResub(p,pAVar3,(int)lVar4,0,0);
          }
        }
      }
    }
    iVar2 = pNtk->vObjs->nSize;
  }
  for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar5);
    if ((((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
        ((iVar2 = p->pPars->nDepthMax, iVar2 == 0 ||
         ((int)(*(uint *)&pAVar3->field_0x14 >> 0xc) <= iVar2)))) &&
       (iVar2 = (pAVar3->vFanins).nSize, iVar2 <= iVar1 && 1 < iVar2)) {
      iVar2 = Abc_WinNode(p,pAVar3);
      if (iVar2 == 0) {
        for (lVar4 = 0; lVar4 < (pAVar3->vFanins).nSize; lVar4 = lVar4 + 1) {
          fVar6 = Abc_MfsObjProb(p,(Abc_Obj_t *)
                                   pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar4]]);
          if (0.2 <= fVar6) {
            Abc_NtkMfsSolveSatResub(p,pAVar3,(int)lVar4,1,0);
          }
        }
      }
    }
    iVar2 = pNtk->vObjs->nSize;
  }
  return;
}

Assistant:

void Abc_NtkMfsPowerResub( Mfs_Man_t * p, Mfs_Par_t * pPars)
{
	int i, k;
	Abc_Obj_t *pFanin, *pNode;
	Abc_Ntk_t *pNtk = p->pNtk;
	int nFaninMax = Abc_NtkGetFaninMax(p->pNtk);

	Abc_NtkForEachNode( pNtk, pNode, k )
	{
		if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
			continue;
		if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax )
			continue;
		if (Abc_WinNode(p, pNode) )  // something wrong
			continue;

		// solve the SAT problem
		// Abc_NtkMfsEdgePower( p, pNode );
		// try replacing area critical fanins
		Abc_ObjForEachFanin( pNode, pFanin, i )
			if ( Abc_MfsObjProb(p, pFanin) >= 0.35 && Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
				continue;
	}

	Abc_NtkForEachNode( pNtk, pNode, k )
	{
		if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
			continue;
		if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax )
			continue;
		if (Abc_WinNode(p, pNode) )  // something wrong
			continue;

		// solve the SAT problem
		// Abc_NtkMfsEdgePower( p, pNode );
		// try replacing area critical fanins
		Abc_ObjForEachFanin( pNode, pFanin, i )
			if ( Abc_MfsObjProb(p, pFanin) >= 0.35 && Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
				continue;
	}

	Abc_NtkForEachNode( pNtk, pNode, k )
	{
		if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
			continue;
		if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax )
			continue;
		if (Abc_WinNode(p, pNode) ) // something wrong
			continue;

		Abc_ObjForEachFanin( pNode, pFanin, i )
			if ( Abc_MfsObjProb(p, pFanin) >= 0.2 && Abc_NtkMfsSolveSatResub( p, pNode, i, 1, 0 ) )
				continue;
	}
/*
	Abc_NtkForEachNode( pNtk, pNode, k )
	{
		if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
			continue;
		if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax - 2)
			continue;
		if (Abc_WinNode(p, pNode) ) // something wrong
			continue;

		Abc_ObjForEachFanin( pNode, pFanin, i )
			if ( Abc_MfsObjProb(p, pFanin) >= 0.37 && Abc_NtkMfsSolveSatResub2( p, pNode, i, -1 ) )
				continue;
	}
*/
}